

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldDefaultInstances
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  bool bVar2;
  FieldGenerator *pFVar3;
  undefined1 local_48 [8];
  Iterator __end3;
  Iterator __begin3;
  
  pDVar1 = this->descriptor_;
  __end3.descriptor._0_4_ = 0;
  local_48._0_4_ = *(undefined4 *)(pDVar1 + 0x68);
  __end3._0_8_ = pDVar1;
  bVar2 = operator==((Iterator *)&__end3.descriptor,(Iterator *)local_48);
  if (!bVar2) {
    do {
      pFVar3 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)
                          ((long)(int)__end3.descriptor * 0x98 + *(long *)(pDVar1 + 0x28)));
      (*pFVar3->_vptr_FieldGenerator[0x12])(pFVar3,printer);
      __end3.descriptor._0_4_ = (int)__end3.descriptor + 1;
      bVar2 = operator==((Iterator *)&__end3.descriptor,(Iterator *)local_48);
    } while (!bVar2);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateFieldDefaultInstances(io::Printer* printer) {
  // Construct the default instances for all fields that need one.
  for (auto field : FieldRange(descriptor_)) {
    field_generators_.get(field).GenerateDefaultInstanceAllocator(printer);
  }
}